

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UChar32 ucnv_MBCSGetNextUChar(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  UConverter *pUVar2;
  uint16_t *puVar3;
  byte bVar4;
  UBool UVar5;
  uint uVar6;
  int32_t (*paiVar7) [256];
  uint uVar8;
  int32_t (*paiVar9) [256];
  bool bVar10;
  char local_81;
  uint8_t *puStack_80;
  int8_t i;
  uint8_t *bytes_1;
  uint8_t *puStack_70;
  UBool isDBCSOnly;
  uint8_t *bytes;
  uint local_60;
  uint8_t action;
  UChar32 c;
  int32_t entry;
  uint8_t state;
  uint32_t offset;
  uint16_t *unicodeCodeUnits;
  int32_t (*stateTable) [256];
  uint8_t *lastSource;
  uint8_t *sourceLimit;
  uint8_t *source;
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pArgs_local;
  
  pUVar2 = pArgs->converter;
  if (pUVar2->preToULength < '\x01') {
    if (((pUVar2->sharedData->mbcs).unicodeMask & 2) == 0) {
      if ((pUVar2->sharedData->mbcs).countStates == '\x01') {
        pArgs_local._4_4_ = ucnv_MBCSSingleGetNextUChar(pArgs,pErrorCode);
      }
      else {
        paiVar7 = (int32_t (*) [256])pArgs->sourceLimit;
        if ((pUVar2->options & 0x10) == 0) {
          unicodeCodeUnits = (uint16_t *)(pUVar2->sharedData->mbcs).stateTable;
        }
        else {
          unicodeCodeUnits = (uint16_t *)(pUVar2->sharedData->mbcs).swapLFNLStateTable;
        }
        puVar3 = (pUVar2->sharedData->mbcs).unicodeCodeUnits;
        entry = pUVar2->toUnicodeStatus;
        c._3_1_ = (byte)pUVar2->mode;
        if ((pUVar2->mode & 0xffU) == 0) {
          c._3_1_ = (pUVar2->sharedData->mbcs).dbcsOnlyState;
        }
        local_60 = 0xffffffff;
        stateTable = (int32_t (*) [256])pArgs->source;
        paiVar9 = (int32_t (*) [256])pArgs->source;
LAB_00392f64:
        do {
          sourceLimit = (uint8_t *)paiVar9;
          if (paiVar7 <= sourceLimit) goto LAB_003932ac;
          paiVar9 = (int32_t (*) [256])(sourceLimit + 1);
          uVar6 = *(uint *)(unicodeCodeUnits + (ulong)c._3_1_ * 0x200 + (ulong)*sourceLimit * 2);
          bVar4 = (byte)(uVar6 >> 0x18);
          if ((int)uVar6 < 0) {
            pUVar2->mode = (uint)c._3_1_;
            c._3_1_ = bVar4 & 0x7f;
            bVar4 = (byte)(uVar6 >> 0x14) & 0xf;
            sourceLimit = (uint8_t *)paiVar9;
            if ((uVar6 >> 0x14 & 0xf) == 0) {
              local_60 = uVar6 & 0xffff;
              goto LAB_003932ac;
            }
            if (bVar4 == 4) {
              uVar6 = (uVar6 & 0xffff) + entry;
              local_60 = (uint)puVar3[uVar6];
              if (local_60 < 0xfffe) goto LAB_003932ac;
              if (local_60 == 0xfffe) {
                local_60 = ucnv_MBCSGetFallback(&pUVar2->sharedData->mbcs,uVar6);
                if (local_60 != 0xfffe) goto LAB_003932ac;
              }
              else {
                *pErrorCode = U_ILLEGAL_CHAR_FOUND;
              }
            }
            else if (bVar4 == 5) {
              uVar6 = (uVar6 & 0xffff) + entry;
              uVar8 = uVar6 + 1;
              local_60 = (uint)puVar3[uVar6];
              if (local_60 < 0xd800) goto LAB_003932ac;
              if (local_60 < 0xe000) {
                local_60 = (local_60 & 0x3ff) * 0x400 + (uint)puVar3[uVar8] + 0x2400;
                goto LAB_003932ac;
              }
              if ((local_60 & 0xfffe) == 0xe000) {
                local_60 = (uint)puVar3[uVar8];
                goto LAB_003932ac;
              }
              if (local_60 == 0xffff) {
                *pErrorCode = U_ILLEGAL_CHAR_FOUND;
              }
            }
            else {
              if ((bVar4 == 1) || (bVar4 == 3)) {
                local_60 = (uVar6 & 0xfffff) + 0x10000;
                goto LAB_003932ac;
              }
              if (bVar4 == 8) {
                if ((pUVar2->sharedData->mbcs).dbcsOnlyState != '\0') {
                  c._3_1_ = (byte)pUVar2->mode;
                  *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                }
              }
              else {
                if (bVar4 == 2) {
                  local_60 = uVar6 & 0xffff;
                  goto LAB_003932ac;
                }
                if (bVar4 != 6) {
                  if (bVar4 != 7) {
                    entry = 0;
                    stateTable = paiVar9;
                    goto LAB_00392f64;
                  }
                  *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                }
              }
            }
            UVar5 = U_FAILURE(*pErrorCode);
            if (UVar5 == '\0') {
              pUVar2->toUnicodeStatus = 0;
              pUVar2->mode = (uint)c._3_1_;
              pArgs->source = (char *)stateTable;
              return -9;
            }
            goto LAB_003932ac;
          }
          entry = (uVar6 & 0xffffff) + entry;
          c._3_1_ = bVar4;
        } while ((((paiVar7 <= paiVar9) ||
                  (uVar6 = *(uint *)(unicodeCodeUnits +
                                    (ulong)bVar4 * 0x200 + (ulong)(byte)(*paiVar9)[0] * 2),
                  -1 < (int)uVar6)) || ((uVar6 >> 0x14 & 0xf) != 4)) ||
                (local_60 = (uint)puVar3[entry + (uVar6 & 0xffff)], 0xfffd < local_60));
        c._3_1_ = (byte)(uVar6 >> 0x18) & 0x7f;
        sourceLimit = sourceLimit + 2;
LAB_003932ac:
        if ((int)local_60 < 0) {
          UVar5 = U_SUCCESS(*pErrorCode);
          if (((UVar5 == '\0') || ((int32_t (*) [256])sourceLimit != paiVar7)) ||
             (sourceLimit <= stateTable)) {
            UVar5 = U_FAILURE(*pErrorCode);
            if (UVar5 == '\0') {
              *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            }
            else {
              uVar1 = (pUVar2->sharedData->mbcs).dbcsOnlyState;
              paiVar7 = (int32_t (*) [256])((long)*stateTable + 1);
              puStack_80 = pUVar2->toUBytes;
              pUVar2->toUBytes[0] = (uint8_t)(*stateTable)[0];
              if (paiVar7 == (int32_t (*) [256])sourceLimit) {
                pUVar2->toULength = '\x01';
              }
              else {
                local_81 = '\x01';
                stateTable = paiVar7;
                while( true ) {
                  puStack_80 = puStack_80 + 1;
                  bVar10 = false;
                  if (stateTable < sourceLimit) {
                    UVar5 = isSingleOrLead((int32_t (*) [256])unicodeCodeUnits,c._3_1_,uVar1 != '\0'
                                           ,(uint8_t)(*stateTable)[0]);
                    bVar10 = UVar5 == '\0';
                  }
                  if (!bVar10) break;
                  *puStack_80 = (uint8_t)(*stateTable)[0];
                  local_81 = local_81 + '\x01';
                  stateTable = (int32_t (*) [256])((long)*stateTable + 1);
                }
                pUVar2->toULength = local_81;
                sourceLimit = (uint8_t *)stateTable;
              }
            }
          }
          else {
            pUVar2->toULength = (char)sourceLimit - (char)stateTable;
            puStack_70 = pUVar2->toUBytes;
            do {
              paiVar7 = (int32_t (*) [256])((long)*stateTable + 1);
              *puStack_70 = (uint8_t)(*stateTable)[0];
              puStack_70 = puStack_70 + 1;
              stateTable = paiVar7;
            } while (paiVar7 < sourceLimit);
            *pErrorCode = U_TRUNCATED_CHAR_FOUND;
          }
          local_60 = 0xffff;
        }
        pUVar2->toUnicodeStatus = 0;
        pUVar2->mode = (uint)c._3_1_;
        pArgs->source = (char *)sourceLimit;
        pArgs_local._4_4_ = local_60;
      }
    }
    else {
      pArgs_local._4_4_ = 0xfffffff7;
    }
  }
  else {
    pArgs_local._4_4_ = 0xfffffff7;
  }
  return pArgs_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
ucnv_MBCSGetNextUChar(UConverterToUnicodeArgs *pArgs,
                  UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit, *lastSource;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;

    int32_t entry;
    UChar32 c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /* use the generic code in ucnv_getNextUChar() to continue with a partial match */
        return UCNV_GET_NEXT_UCHAR_USE_TO_U;
    }

    if(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SURROGATES) {
        /*
         * Using the generic ucnv_getNextUChar() code lets us deal correctly
         * with the rare case of a codepage that maps single surrogates
         * without adding the complexity to this already complicated function here.
         */
        return UCNV_GET_NEXT_UCHAR_USE_TO_U;
    } else if(cnv->sharedData->mbcs.countStates==1) {
        return ucnv_MBCSSingleGetNextUChar(pArgs, pErrorCode);
    }

    /* set up the local pointers */
    source=lastSource=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* conversion loop */
    c=U_SENTINEL;
    while(source<sourceLimit) {
        entry=stateTable[state][*source++];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);

            /* optimization for 1/2-byte input and BMP output */
            if( source<sourceLimit &&
                MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
            ) {
                ++source;
                state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                /* output BMP code point */
                break;
            }
        } else {
            /* save the previous state for proper extension mapping with SI/SO-stateful converters */
            cnv->mode=state;

            /* set the next state early so that we can reuse the entry variable */
            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
            if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_VALID_16) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset];
                if(c<0xfffe) {
                    /* output BMP code point */
                    break;
                } else if(c==0xfffe) {
                    if(UCNV_TO_U_USE_FALLBACK(cnv) && (c=ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                        break;
                    }
                } else {
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                    break;
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=((c&0x3ff)<<10)+unicodeCodeUnits[offset]+(0x10000-0xdc00);
                    break;
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[offset];
                    break;
                } else if(c==0xffff) {
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                      (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
            ) {
                /* output supplementary code point */
                c=(UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
                break;
            } else if(action==MBCS_STATE_CHANGE_ONLY) {
                /*
                 * This serves as a state change without any output.
                 * It is useful for reading simple stateful encodings,
                 * for example using just Shift-In/Shift-Out codes.
                 * The 21 unused bits may later be used for more sophisticated
                 * state transitions.
                 */
                if(cnv->sharedData->mbcs.dbcsOnlyState!=0) {
                    /* SI/SO are illegal for DBCS-only conversion */
                    state=(uint8_t)(cnv->mode); /* restore the previous state */

                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
                if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                    /* output BMP code point */
                    c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                    break;
                }
            } else if(action==MBCS_STATE_UNASSIGNED) {
                /* just fall through */
            } else if(action==MBCS_STATE_ILLEGAL) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            } else {
                /* reserved (must never occur), or only state change */
                offset=0;
                lastSource=source;
                continue;
            }

            /* end of action codes: prepare for a new character */
            offset=0;

            if(U_FAILURE(*pErrorCode)) {
                /* callback(illegal) */
                break;
            } else /* unassigned sequence */ {
                /* defer to the generic implementation */
                cnv->toUnicodeStatus=0;
                cnv->mode=state;
                pArgs->source=(const char *)lastSource;
                return UCNV_GET_NEXT_UCHAR_USE_TO_U;
            }
        }
    }

    if(c<0) {
        if(U_SUCCESS(*pErrorCode) && source==sourceLimit && lastSource<source) {
            /* incomplete character byte sequence */
            uint8_t *bytes=cnv->toUBytes;
            cnv->toULength=(int8_t)(source-lastSource);
            do {
                *bytes++=*lastSource++;
            } while(lastSource<source);
            *pErrorCode=U_TRUNCATED_CHAR_FOUND;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            /*
             * Ticket 5691: consistent illegal sequences:
             * - We include at least the first byte in the illegal sequence.
             * - If any of the non-initial bytes could be the start of a character,
             *   we stop the illegal sequence before the first one of those.
             */
            UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
            uint8_t *bytes=cnv->toUBytes;
            *bytes++=*lastSource++;     /* first byte */
            if(lastSource==source) {
                cnv->toULength=1;
            } else /* lastSource<source: multi-byte character */ {
                int8_t i;
                for(i=1;
                    lastSource<source && !isSingleOrLead(stateTable, state, isDBCSOnly, *lastSource);
                    ++i
                ) {
                    *bytes++=*lastSource++;
                }
                cnv->toULength=i;
                source=lastSource;
            }
        } else {
            /* no output because of empty input or only state changes */
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        }
        c=0xffff;
    }

    /* set the converter state back into UConverter, ready for a new character */
    cnv->toUnicodeStatus=0;
    cnv->mode=state;

    /* write back the updated pointer */
    pArgs->source=(const char *)source;
    return c;
}